

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O1

bool __thiscall ResourceDirWrapper::wrap(ResourceDirWrapper *this)

{
  WORD WVar1;
  int iVar2;
  ulong uVar3;
  ResourceEntryWrapper *this_00;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  ResourceEntryWrapper *entryNumber;
  ulong uVar5;
  ResourceEntryWrapper *pRVar6;
  ResourceEntryWrapper *topEntryId;
  bool bVar7;
  ResourceEntryWrapper *local_48;
  IMAGE_RESOURCE_DIRECTORY *local_40;
  ResourceEntryWrapper *local_38;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
    ResourcesAlbum::clear(this->album);
  }
  local_40 = resourceDir(this);
  if ((local_40 != (IMAGE_RESOURCE_DIRECTORY *)0x0) &&
     (uVar3 = (ulong)local_40->NumberOfIdEntries + (ulong)local_40->NumberOfNamedEntries, uVar3 != 0
     )) {
    uVar5 = 0x32;
    if (uVar3 < 0x32) {
      uVar5 = uVar3;
    }
    pRVar6 = (ResourceEntryWrapper *)((uVar5 - 1) + (ulong)(uVar5 == 0));
    entryNumber = (ResourceEntryWrapper *)0x0;
    local_38 = pRVar6;
    do {
      topEntryId = (ResourceEntryWrapper *)this->topEntryID;
      if ((ResourceEntryWrapper *)this->topEntryID == (ResourceEntryWrapper *)0xffffffffffffffff) {
        topEntryId = entryNumber;
      }
      this_00 = (ResourceEntryWrapper *)operator_new(0x70);
      ResourceEntryWrapper::ResourceEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.m_PE,this,
                 (size_t)entryNumber,(long)topEntryId,this->album);
      iVar2 = (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this_00);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
      }
      else {
        if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
          WVar1 = ResourceEntryWrapper::getID(this_00);
          local_48 = entryNumber;
          pmVar4 = std::
                   map<long,_pe::resource_type,_std::less<long>,_std::allocator<std::pair<const_long,_pe::resource_type>_>_>
                   ::operator[](&this->album->idToLeafType,(key_type_conflict *)&local_48);
          *pmVar4 = (uint)WVar1;
          pRVar6 = local_38;
        }
        local_48 = this_00;
        std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                  ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                   &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                    entries,(ExeNodeWrapper **)&local_48);
      }
    } while ((CONCAT44(extraout_var,iVar2) != 0) &&
            (bVar7 = pRVar6 != entryNumber,
            entryNumber = (ResourceEntryWrapper *)
                          ((long)&(entryNumber->super_PENodeWrapper).super_ExeNodeWrapper.
                                  super_ExeElementWrapper.super_AbstractByteBuffer.
                                  _vptr_AbstractByteBuffer + 1), bVar7));
  }
  return local_40 != (IMAGE_RESOURCE_DIRECTORY *)0x0;
}

Assistant:

bool ResourceDirWrapper::wrap()
{
    clear();
    if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
        this->album->clear();
    }
    IMAGE_RESOURCE_DIRECTORY* dir = resourceDir();
    if (dir == NULL) return false;
    size_t namesNum = dir->NumberOfNamedEntries;
    size_t idsNum = dir->NumberOfIdEntries;

    size_t totalEntries = namesNum + idsNum;
    for (size_t i = 0; i < totalEntries && i < MAX_ENTRIES; i++ ) {

        long topDirId = (this->topEntryID != TOP_ENTRY_ROOT) ? this->topEntryID : long(i) ;

        //ResourceEntryWrapper(PEFile *pe, ResourceDirWrapper *parentDir, size_t entryNumber, long topEntryId, ResourcesAlbum *resAlbum)
        ResourceEntryWrapper* entry = new ResourceEntryWrapper(this->m_PE, this, i, topDirId, this->album);

        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
            pe::resource_type typeId = static_cast<pe::resource_type>(entry->getID());
            this->album->mapIdToLeafType(i, typeId);
        }
        //this->parsedSize += val;
        this->entries.push_back(entry);
    }
    //printf("Entries: %d\n", getEntriesCount());
    return true;
}